

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t restore_entry(archive_write_disk *a)

{
  long lVar1;
  int iVar2;
  int *piVar3;
  uint *puVar4;
  archive *in_RDI;
  wchar_t r;
  wchar_t en;
  wchar_t ret;
  char *in_stack_ffffffffffffffc0;
  archive_write_disk *in_stack_ffffffffffffffc8;
  archive_entry *in_stack_ffffffffffffffd0;
  stat_conflict *in_stack_ffffffffffffffd8;
  int local_1c;
  wchar_t local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  wchar_t wVar5;
  
  if (((in_RDI[4].magic & 0x10) != 0) &&
     (((ulong)in_RDI[4].compression_name & 0xf00000000000) != 0x400000000000)) {
    iVar2 = unlink((char *)in_RDI[3].error_string.length);
    if (iVar2 == 0) {
      in_RDI[3].error = (char *)0x0;
    }
    else {
      piVar3 = __errno_location();
      if (*piVar3 != 2) {
        iVar2 = rmdir((char *)in_RDI[3].error_string.length);
        if (iVar2 != 0) {
          puVar4 = (uint *)__errno_location();
          archive_set_error(in_RDI,(int)(ulong)*puVar4,"Could not unlink");
          return L'\xffffffe7';
        }
        in_RDI[3].error = (char *)0x0;
      }
    }
  }
  local_18 = create_filesystem_object
                       ((archive_write_disk *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (((local_18 == L'\x14') || (local_18 == L'\x02')) && ((in_RDI[4].magic & 0x400) == 0)) {
    create_parent_dir(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    local_18 = create_filesystem_object
                         ((archive_write_disk *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  if (((local_18 == L'\x15') || (local_18 == L'\x11')) && ((in_RDI[4].magic & 8) != 0)) {
    archive_entry_unset_size((archive_entry *)0x16b98d);
    return L'\0';
  }
  if (local_18 == L'\x15') {
    iVar2 = rmdir((char *)in_RDI[3].error_string.length);
    if (iVar2 != 0) {
      puVar4 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t remove already-existing dir");
      return L'\xffffffe7';
    }
    in_RDI[3].error = (char *)0x0;
    local_18 = create_filesystem_object
                         ((archive_write_disk *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  }
  else if (local_18 == L'\x11') {
    local_1c = 0;
    if (((ulong)in_RDI[4].compression_name & 0xf00000000000) == 0x400000000000) {
      local_1c = stat((char *)in_RDI[3].error_string.length,(stat *)&in_RDI[2].archive_format_name);
    }
    if ((local_1c != 0) || (((ulong)in_RDI[4].compression_name & 0xf00000000000) != 0x400000000000))
    {
      local_1c = lstat((char *)in_RDI[3].error_string.length,(stat *)&in_RDI[2].archive_format_name)
      ;
    }
    if (local_1c != 0) {
      puVar4 = (uint *)__errno_location();
      archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t stat existing object");
      return L'\xffffffe7';
    }
    if ((((in_RDI[4].magic & 0x800) != 0) && ((in_RDI[2].file_count & 0xf000U) != 0x4000)) &&
       (wVar5 = older(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0), wVar5 == L'\0')) {
      archive_entry_unset_size((archive_entry *)0x16bb2c);
      return L'\0';
    }
    if (((in_RDI[1].compression_code != 0) &&
        (in_RDI[2].archive_format_name == in_RDI[1].compression_name)) &&
       (lVar1._0_4_ = in_RDI[1].file_count, lVar1._4_4_ = in_RDI[1].archive_error_number,
       *(long *)&in_RDI[2].compression_code == lVar1)) {
      archive_set_error(in_RDI,0,"Refusing to overwrite archive");
      return L'\xffffffe7';
    }
    if ((in_RDI[2].file_count & 0xf000U) == 0x4000) {
      if (((ulong)in_RDI[4].compression_name & 0xf00000000000) == 0x400000000000) {
        if ((*(int *)((long)&in_RDI[4].compression_name + 4) != in_RDI[2].file_count) &&
           (((ulong)in_RDI[3].sconv & 0x40000000) != 0)) {
          *(uint *)((long)&in_RDI[3].sconv + 4) =
               *(uint *)&in_RDI[3].sconv & 0x34000000 | *(uint *)((long)&in_RDI[3].sconv + 4);
        }
        local_18 = L'\0';
      }
      else {
        iVar2 = rmdir((char *)in_RDI[3].error_string.length);
        if (iVar2 != 0) {
          puVar4 = (uint *)__errno_location();
          archive_set_error(in_RDI,(int)(ulong)*puVar4,
                            "Can\'t replace existing directory with non-directory");
          return L'\xffffffe7';
        }
        local_18 = create_filesystem_object
                             ((archive_write_disk *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      }
    }
    else {
      iVar2 = unlink((char *)in_RDI[3].error_string.length);
      if (iVar2 != 0) {
        puVar4 = (uint *)__errno_location();
        archive_set_error(in_RDI,(int)(ulong)*puVar4,"Can\'t unlink already-existing object");
        return L'\xffffffe7';
      }
      in_RDI[3].error = (char *)0x0;
      local_18 = create_filesystem_object
                           ((archive_write_disk *)
                            CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    }
  }
  if (local_18 == L'\0') {
    in_RDI[3].error = (char *)0x0;
    wVar5 = L'\0';
  }
  else {
    archive_set_error(in_RDI,(int)(ulong)(uint)local_18,"Can\'t create \'%s\'",
                      in_RDI[3].error_string.length);
    wVar5 = L'\xffffffe7';
  }
  return wVar5;
}

Assistant:

static int
restore_entry(struct archive_write_disk *a)
{
	int ret = ARCHIVE_OK, en;

	if (a->flags & ARCHIVE_EXTRACT_UNLINK && !S_ISDIR(a->mode)) {
		/*
		 * TODO: Fix this.  Apparently, there are platforms
		 * that still allow root to hose the entire filesystem
		 * by unlinking a dir.  The S_ISDIR() test above
		 * prevents us from using unlink() here if the new
		 * object is a dir, but that doesn't mean the old
		 * object isn't a dir.
		 */
		if (unlink(a->name) == 0) {
			/* We removed it, reset cached stat. */
			a->pst = NULL;
		} else if (errno == ENOENT) {
			/* File didn't exist, that's just as good. */
		} else if (rmdir(a->name) == 0) {
			/* It was a dir, but now it's gone. */
			a->pst = NULL;
		} else {
			/* We tried, but couldn't get rid of it. */
			archive_set_error(&a->archive, errno,
			    "Could not unlink");
			return(ARCHIVE_FAILED);
		}
	}

	/* Try creating it first; if this fails, we'll try to recover. */
	en = create_filesystem_object(a);

	if ((en == ENOTDIR || en == ENOENT)
	    && !(a->flags & ARCHIVE_EXTRACT_NO_AUTODIR)) {
		/* If the parent dir doesn't exist, try creating it. */
		create_parent_dir(a, a->name);
		/* Now try to create the object again. */
		en = create_filesystem_object(a);
	}

	if ((en == EISDIR || en == EEXIST)
	    && (a->flags & ARCHIVE_EXTRACT_NO_OVERWRITE)) {
		/* If we're not overwriting, we're done. */
		archive_entry_unset_size(a->entry);
		return (ARCHIVE_OK);
	}

	/*
	 * Some platforms return EISDIR if you call
	 * open(O_WRONLY | O_EXCL | O_CREAT) on a directory, some
	 * return EEXIST.  POSIX is ambiguous, requiring EISDIR
	 * for open(O_WRONLY) on a dir and EEXIST for open(O_EXCL | O_CREAT)
	 * on an existing item.
	 */
	if (en == EISDIR) {
		/* A dir is in the way of a non-dir, rmdir it. */
		if (rmdir(a->name) != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't remove already-existing dir");
			return (ARCHIVE_FAILED);
		}
		a->pst = NULL;
		/* Try again. */
		en = create_filesystem_object(a);
	} else if (en == EEXIST) {
		/*
		 * We know something is in the way, but we don't know what;
		 * we need to find out before we go any further.
		 */
		int r = 0;
		/*
		 * The SECURE_SYMLINKS logic has already removed a
		 * symlink to a dir if the client wants that.  So
		 * follow the symlink if we're creating a dir.
		 */
		if (S_ISDIR(a->mode))
			r = stat(a->name, &a->st);
		/*
		 * If it's not a dir (or it's a broken symlink),
		 * then don't follow it.
		 */
		if (r != 0 || !S_ISDIR(a->mode))
			r = lstat(a->name, &a->st);
		if (r != 0) {
			archive_set_error(&a->archive, errno,
			    "Can't stat existing object");
			return (ARCHIVE_FAILED);
		}

		/*
		 * NO_OVERWRITE_NEWER doesn't apply to directories.
		 */
		if ((a->flags & ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER)
		    &&  !S_ISDIR(a->st.st_mode)) {
			if (!older(&(a->st), a->entry)) {
				archive_entry_unset_size(a->entry);
				return (ARCHIVE_OK);
			}
		}

		/* If it's our archive, we're done. */
		if (a->skip_file_set &&
		    a->st.st_dev == (dev_t)a->skip_file_dev &&
		    a->st.st_ino == (ino_t)a->skip_file_ino) {
			archive_set_error(&a->archive, 0,
			    "Refusing to overwrite archive");
			return (ARCHIVE_FAILED);
		}

		if (!S_ISDIR(a->st.st_mode)) {
			/* A non-dir is in the way, unlink it. */
			if (unlink(a->name) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't unlink already-existing object");
				return (ARCHIVE_FAILED);
			}
			a->pst = NULL;
			/* Try again. */
			en = create_filesystem_object(a);
		} else if (!S_ISDIR(a->mode)) {
			/* A dir is in the way of a non-dir, rmdir it. */
			if (rmdir(a->name) != 0) {
				archive_set_error(&a->archive, errno,
				    "Can't replace existing directory with non-directory");
				return (ARCHIVE_FAILED);
			}
			/* Try again. */
			en = create_filesystem_object(a);
		} else {
			/*
			 * There's a dir in the way of a dir.  Don't
			 * waste time with rmdir()/mkdir(), just fix
			 * up the permissions on the existing dir.
			 * Note that we don't change perms on existing
			 * dirs unless _EXTRACT_PERM is specified.
			 */
			if ((a->mode != a->st.st_mode)
			    && (a->todo & TODO_MODE_FORCE))
				a->deferred |= (a->todo & TODO_MODE);
			/* Ownership doesn't need deferred fixup. */
			en = 0; /* Forget the EEXIST. */
		}
	}

	if (en) {
		/* Everything failed; give up here. */
		archive_set_error(&a->archive, en, "Can't create '%s'",
		    a->name);
		return (ARCHIVE_FAILED);
	}

	a->pst = NULL; /* Cached stat data no longer valid. */
	return (ret);
}